

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImVec2 InputTextCalcTextSizeW
                 (ImWchar *text_begin,ImWchar *text_end,ImWchar **remaining,ImVec2 *out_offset,
                 bool stop_on_new_line)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  float *pfVar4;
  ImVec2 *in_RCX;
  undefined8 *in_RDX;
  ImFont *in_RSI;
  ImFont *in_RDI;
  byte in_R8B;
  float char_width;
  uint c;
  ImWchar *s;
  float line_width;
  float scale;
  float line_height;
  ImFont *font;
  ImVec2 text_size;
  ImVec2 local_60;
  float local_58;
  ImFont *this;
  float local_44;
  ImVec2 local_8;
  
  fVar1 = GImGui->FontSize;
  fVar2 = GImGui->Font->FontSize;
  ImVec2::ImVec2(&local_8,0.0,0.0);
  local_44 = 0.0;
  do {
    while( true ) {
      this = in_RDI;
      if (in_RSI <= in_RDI) goto LAB_0018b200;
      this = (ImFont *)((long)&in_RDI->FontSize + 2);
      pfVar4 = &in_RDI->FontSize;
      if (*(short *)pfVar4 == 10) break;
      in_RDI = this;
      if (*(short *)pfVar4 != 0xd) {
        local_58 = ImFont::GetCharAdvance(this,0);
        local_58 = local_58 * (fVar1 / fVar2);
        local_44 = local_58 + local_44;
        in_RDI = this;
      }
    }
    local_8.x = ImMax<float>(local_8.x,local_44);
    local_8.y = fVar1 + local_8.y;
    local_44 = 0.0;
    in_RDI = this;
  } while ((in_R8B & 1) == 0);
LAB_0018b200:
  if (local_8.x < local_44) {
    local_8.x = local_44;
  }
  if (in_RCX != (ImVec2 *)0x0) {
    ImVec2::ImVec2(&local_60,local_44,local_8.y + fVar1);
    *in_RCX = local_60;
  }
  if ((0.0 < local_44) || ((local_8.y == 0.0 && (!NAN(local_8.y))))) {
    local_8.y = fVar1 + local_8.y;
  }
  if (in_RDX != (undefined8 *)0x0) {
    *in_RDX = this;
  }
  IVar3.y = local_8.y;
  IVar3.x = local_8.x;
  return IVar3;
}

Assistant:

static ImVec2 InputTextCalcTextSizeW(const ImWchar* text_begin, const ImWchar* text_end, const ImWchar** remaining, ImVec2* out_offset, bool stop_on_new_line)
{
    ImFont* font = GImGui->Font;
    const float line_height = GImGui->FontSize;
    const float scale = line_height / font->FontSize;

    ImVec2 text_size = ImVec2(0,0);
    float line_width = 0.0f;

    const ImWchar* s = text_begin;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)(*s++);
        if (c == '\n')
        {
            text_size.x = ImMax(text_size.x, line_width);
            text_size.y += line_height;
            line_width = 0.0f;
            if (stop_on_new_line)
                break;
            continue;
        }
        if (c == '\r')
            continue;

        const float char_width = font->GetCharAdvance((ImWchar)c) * scale;
        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (out_offset)
        *out_offset = ImVec2(line_width, text_size.y + line_height);  // offset allow for the possibility of sitting after a trailing \n

    if (line_width > 0 || text_size.y == 0.0f)                        // whereas size.y will ignore the trailing \n
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}